

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLDateTime::parseYearMonth(XMLDateTime *this)

{
  SchemaDateTimeException *this_00;
  XMLCh *text1;
  
  if ((this->fBuffer != (XMLCh *)0x0) && (*this->fBuffer != L'\0')) {
    this->fStart = 0;
    getYearMonth(this);
    this->fValue[2] = 0xf;
    parseTimeZone(this);
    validateDateTime(this);
    normalize(this);
    return;
  }
  this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
  text1 = this->fBuffer;
  if (text1 == (XMLCh *)0x0) {
    text1 = L"";
  }
  SchemaDateTimeException::SchemaDateTimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
             ,0x355,DateTime_ym_invalid,text1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
             this->fMemoryManager);
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::parseYearMonth()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    // get date
    getYearMonth();
    fValue[Day] = DAY_DEFAULT;
    parseTimeZone();

    validateDateTime();
    normalize();
}